

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

bool __thiscall USBControlTransferParser::ParseStringDescriptor(USBControlTransferParser *this)

{
  byte bVar1;
  USBAnalyzerResults *pUVar2;
  bool bVar3;
  U8 UVar4;
  byte bVar5;
  U32 UVar6;
  undefined1 local_f0 [8];
  string utf8_string_descriptor;
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  char16_t code_unit;
  USBControlTransferParser *local_10;
  USBControlTransferParser *this_local;
  
  local_10 = this;
  UVar4 = USBRequest::GetRequestedDescriptorIndex(&this->mRequest);
  if (UVar4 == '\0') {
    while( true ) {
      bVar3 = false;
      if (this->mParsedOffset < this->mDescBytes) {
        bVar3 = this->mPacketOffset < this->mPacketDataBytes;
      }
      if (!bVar3) break;
      pUVar2 = this->pResults;
      USBPacket::GetDataPayloadField
                ((USBPacket *)&stack0xffffffffffffffc8,(int)this->pPacket,this->mPacketOffset,'\x02'
                 ,(char *)(ulong)this->mAddress,0x168ee5,'\x12');
      AnalyzerResults::AddFrame((Frame *)pUVar2);
      Frame::~Frame((Frame *)&stack0xffffffffffffffc8);
      this->mPacketOffset = this->mPacketOffset + 2;
      this->mParsedOffset = this->mParsedOffset + 2;
    }
  }
  else {
    if (this->mParsedOffset == 2) {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      clear(&this->utf16StringDescriptor);
    }
    while( true ) {
      bVar3 = false;
      if (this->mParsedOffset < this->mDescBytes) {
        bVar3 = this->mPacketOffset < this->mPacketDataBytes;
      }
      if (!bVar3) break;
      UVar6 = USBPacket::GetDataPayload(this->pPacket,this->mPacketOffset,2);
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(&this->utf16StringDescriptor,(char16_t)UVar6);
      pUVar2 = this->pResults;
      USBPacket::GetDataPayloadField
                ((USBPacket *)&convert._M_with_cvtstate,(int)this->pPacket,this->mPacketOffset,
                 '\x02',(char *)(ulong)this->mAddress,0x168eed,'\x1b');
      AnalyzerResults::AddFrame((Frame *)pUVar2);
      Frame::~Frame((Frame *)&convert._M_with_cvtstate);
      this->mPacketOffset = this->mPacketOffset + 2;
      this->mParsedOffset = this->mParsedOffset + 2;
    }
    if (this->mDescBytes == this->mParsedOffset) {
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                         *)&stack0xffffffffffffff30);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::to_bytes((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                  *)local_f0,(wide_string *)&stack0xffffffffffffff30);
      pUVar2 = this->pResults;
      bVar1 = this->mAddress;
      bVar5 = USBRequest::GetRequestedDescriptorIndex(&this->mRequest);
      USBAnalyzerResults::AddStringDescriptor(pUVar2,(uint)bVar1,(uint)bVar5,(string *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                          *)&stack0xffffffffffffff30);
    }
  }
  return this->mDescBytes == this->mParsedOffset;
}

Assistant:

bool USBControlTransferParser::ParseStringDescriptor()
{
    // if this is a supported language table desriptor or actual string descriptor
    if( mRequest.GetRequestedDescriptorIndex() == 0 )
    {
        while( mDescBytes > mParsedOffset && mPacketDataBytes > mPacketOffset )
        {
            pResults->AddFrame( pPacket->GetDataPayloadField( mPacketOffset, 2, mAddress, "wLANGID", Fld_wLANGID ) );
            mPacketOffset += 2;
            mParsedOffset += 2;
        }
    }
    else
    {
        if( mParsedOffset == 2 )
            utf16StringDescriptor.clear();

        // the actual UNICODE string
        while( mDescBytes > mParsedOffset && mPacketDataBytes > mPacketOffset )
        {
            char16_t code_unit = static_cast<char16_t>( pPacket->GetDataPayload( mPacketOffset, 2 ) );
            utf16StringDescriptor.push_back( code_unit );

            pResults->AddFrame( pPacket->GetDataPayloadField( mPacketOffset, 2, mAddress, "wchar", Fld_Wchar ) );
            mPacketOffset += 2;
            mParsedOffset += 2;
        }

        // do we have the entire string?
        if( mDescBytes == mParsedOffset )
        {
            std::wstring_convert<std::codecvt_utf8_utf16<char16_t>, char16_t> convert;
            std::string utf8_string_descriptor = convert.to_bytes( utf16StringDescriptor );
            pResults->AddStringDescriptor( mAddress, mRequest.GetRequestedDescriptorIndex(), utf8_string_descriptor );
        }
    }
    // return true if we've finished parsing the string descriptor, according to the parsed bLength
    return mDescBytes == mParsedOffset;
}